

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

void __thiscall
icu_63::MessagePattern::setParseError(MessagePattern *this,UParseError *parseError,int32_t index)

{
  UnicodeString *this_00;
  short sVar1;
  char16_t cVar2;
  uint uVar3;
  int iVar4;
  
  if (parseError != (UParseError *)0x0) {
    parseError->offset = index;
    uVar3 = index;
    if (0xf < index) {
      cVar2 = UnicodeString::doCharAt(&this->msg,index + -0xf);
      uVar3 = (cVar2 & 0xfc00U) == 0xdc00 ^ 0xf;
    }
    this_00 = &this->msg;
    UnicodeString::doExtract(this_00,index - uVar3,uVar3,parseError->preContext,0);
    parseError->preContext[(int)uVar3] = L'\0';
    sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->msg).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    uVar3 = iVar4 - index;
    if (0xf < (int)uVar3) {
      cVar2 = UnicodeString::doCharAt(this_00,index + 0xe);
      uVar3 = (cVar2 & 0xfc00U) == 0xd800 ^ 0xf;
    }
    UnicodeString::doExtract(this_00,index,uVar3,parseError->postContext,0);
    parseError->postContext[(int)uVar3] = L'\0';
  }
  return;
}

Assistant:

void
MessagePattern::setParseError(UParseError *parseError, int32_t index) {
    if(parseError==NULL) {
        return;
    }
    parseError->offset=index;

    // Set preContext to some of msg before index.
    // Avoid splitting a surrogate pair.
    int32_t length=index;
    if(length>=U_PARSE_CONTEXT_LEN) {
        length=U_PARSE_CONTEXT_LEN-1;
        if(length>0 && U16_IS_TRAIL(msg[index-length])) {
            --length;
        }
    }
    msg.extract(index-length, length, parseError->preContext);
    parseError->preContext[length]=0;

    // Set postContext to some of msg starting at index.
    length=msg.length()-index;
    if(length>=U_PARSE_CONTEXT_LEN) {
        length=U_PARSE_CONTEXT_LEN-1;
        if(length>0 && U16_IS_LEAD(msg[index+length-1])) {
            --length;
        }
    }
    msg.extract(index, length, parseError->postContext);
    parseError->postContext[length]=0;
}